

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_encode(uchar **out,size_t *outsize,uchar *image,uint w,uint h,LodePNGState *state)

{
  char *pcVar1;
  char *textstring;
  long lVar2;
  LodePNGEncoderSettings *pLVar3;
  undefined4 colortype;
  undefined8 uVar4;
  undefined4 uVar5;
  uint uVar6;
  int iVar7;
  uchar *out_00;
  size_t sVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  uchar **ppuVar13;
  ucvector outv;
  uchar *data;
  size_t datasize;
  LodePNGInfo info;
  ucvector local_168;
  LodePNGEncoderSettings *local_150;
  long local_148;
  uchar *local_140;
  LodePNGColorMode *local_138;
  uchar **local_130;
  size_t local_128;
  size_t *local_120;
  undefined1 local_118 [32];
  size_t sStack_f8;
  uint uStack_f0;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  undefined4 local_a0;
  undefined4 uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  uint local_90;
  LodePNGTime local_8c;
  uint local_74;
  uchar *local_60;
  uchar *puStack_58;
  uchar *puStack_50;
  uchar *puStack_48;
  size_t local_40;
  size_t local_38;
  
  local_140 = (uchar *)0x0;
  local_128 = 0;
  *out = (uchar *)0x0;
  *outsize = 0;
  state->error = 0;
  local_118._16_8_ = 0x800000006;
  register0x00001200 = ZEXT1632(ZEXT816(0) << 0x40);
  local_118._8_4_ = 0;
  local_118._0_4_ = 0;
  local_118._4_4_ = 0;
  local_74 = 0;
  local_e0._0_4_ = 0;
  local_e0._4_4_ = 0;
  uStack_d8._0_4_ = 0;
  uStack_d8._4_4_ = 0;
  uStack_d0 = 0;
  uStack_cc = 0;
  uStack_c8 = 0;
  uStack_c4 = 0;
  uStack_c0 = 0;
  uStack_bc = 0;
  uStack_b8 = 0;
  uStack_b4 = 0;
  uStack_b0 = 0;
  uStack_ac = 0;
  uStack_a8 = 0;
  uStack_a4 = 0;
  local_a0 = 0;
  uStack_9c = 0;
  local_98 = 0;
  uStack_94 = 0;
  local_90 = 0;
  local_60 = (uchar *)0x0;
  puStack_58 = (uchar *)0x0;
  local_40 = 0;
  local_38 = 0;
  local_120 = outsize;
  puStack_50 = local_60;
  puStack_48 = puStack_58;
  lodepng_info_copy((LodePNGInfo *)local_118,&state->info_png);
  if (((local_118._16_4_ == LCT_PALETTE) || ((state->encoder).force_palette != 0)) &&
     (sStack_f8 - 0x101 < 0xffffffffffffff00)) {
    state->error = 0x44;
    return 0x44;
  }
  if ((state->encoder).auto_convert != 0) {
    uVar6 = lodepng_auto_choose_color
                      ((LodePNGColorMode *)(local_118 + 0x10),image,w,h,&state->info_raw);
    state->error = uVar6;
  }
  uVar4 = local_118._16_8_;
  if (state->error != 0) {
    return state->error;
  }
  local_150 = &state->encoder;
  if (2 < (local_150->zlibsettings).btype) {
    state->error = 0x3d;
    return 0x3d;
  }
  if (1 < (state->info_png).interlace_method) {
    state->error = 0x47;
    return 0x47;
  }
  colortype = local_118._16_4_;
  uVar12 = local_118._16_8_ & 0xffffffff;
  uVar5 = local_118._20_4_;
  local_130 = out;
  uVar6 = checkColorValidity(local_118._16_4_,local_118._20_4_);
  state->error = uVar6;
  if (uVar6 != 0) {
    return uVar6;
  }
  local_148 = CONCAT44(local_148._4_4_,uVar5);
  uVar6 = checkColorValidity((state->info_raw).colortype,(state->info_raw).bitdepth);
  state->error = uVar6;
  if (uVar6 != 0) {
    return uVar6;
  }
  iVar7 = lodepng_color_mode_equal(&state->info_raw,(LodePNGColorMode *)(local_118 + 0x10));
  ppuVar13 = local_130;
  if (iVar7 == 0) {
    iVar7 = 0;
    if ((uint)colortype < 7) {
      iVar7 = *(int *)(&DAT_004d4c44 + uVar12 * 4);
    }
    lVar11 = (ulong)(uint)(iVar7 * local_118._20_4_) * (ulong)(h * w);
    local_138 = &state->info_raw;
    out_00 = (uchar *)malloc(lVar11 + 7U >> 3);
    pLVar3 = local_150;
    if (lVar11 != 0 && out_00 == (uchar *)0x0) {
      state->error = 0x53;
    }
    if (state->error == 0) {
      uVar6 = lodepng_convert(out_00,image,(LodePNGColorMode *)(local_118 + 0x10),local_138,w,h);
      state->error = uVar6;
    }
    if (state->error == 0) {
      preProcessScanlines(&local_140,&local_128,out_00,w,h,(LodePNGInfo *)local_118,pLVar3);
    }
    free(out_00);
  }
  else {
    preProcessScanlines(&local_140,&local_128,image,w,h,(LodePNGInfo *)local_118,local_150);
    ppuVar13 = local_130;
  }
  uVar6 = (uint)local_148;
  local_168.data = (uchar *)0x0;
  local_168.size = 0;
  local_168.allocsize = 0;
  if (state->error == 0) {
    writeSignature(&local_168);
    pLVar3 = local_150;
    addChunk_IHDR(&local_168,w,h,colortype,uVar6,local_118._8_4_);
    if (local_60 != (uchar *)0x0) {
      uVar6 = addUnknownChunks(&local_168,local_60,(size_t)puStack_48);
      state->error = uVar6;
      if (uVar6 != 0) goto LAB_00343806;
    }
    if (colortype == LCT_PALETTE) {
      addChunk_PLTE(&local_168,(LodePNGColorMode *)(local_118 + 0x10));
    }
    if (((colortype & ~LCT_GREY_ALPHA) == LCT_RGB) && ((state->encoder).force_palette != 0)) {
      addChunk_PLTE(&local_168,(LodePNGColorMode *)(local_118 + 0x10));
    }
    if (colortype == LCT_PALETTE) {
      uVar6 = getPaletteTranslucency((uchar *)local_118._24_8_,sStack_f8);
      if (uVar6 != 0) {
        addChunk_tRNS(&local_168,(LodePNGColorMode *)(local_118 + 0x10));
      }
    }
    if (((uVar4 & 0xfffffffd) == 0) && (uStack_f0 != 0)) {
      addChunk_tRNS(&local_168,(LodePNGColorMode *)(local_118 + 0x10));
    }
    ppuVar13 = local_130;
    if ((uint)local_e0 != 0) {
      addChunk_bKGD(&local_168,(LodePNGInfo *)local_118);
    }
    if (local_74 != 0) {
      addChunk_pHYs(&local_168,(LodePNGInfo *)local_118);
    }
    if (puStack_58 != (uchar *)0x0) {
      uVar6 = addUnknownChunks(&local_168,puStack_58,local_40);
      state->error = uVar6;
      if (uVar6 != 0) goto LAB_00343806;
    }
    uVar6 = addChunk_IDAT(&local_168,local_140,local_128,&pLVar3->zlibsettings);
    state->error = uVar6;
    if (uVar6 == 0) {
      if (local_90 != 0) {
        addChunk_tIME(&local_168,&local_8c);
      }
      lVar11 = CONCAT44(uStack_cc,uStack_d0);
      if (lVar11 != 0) {
        lVar2 = CONCAT44(uStack_c4,uStack_c8);
        lVar9 = CONCAT44(uStack_bc,uStack_c0);
        lVar10 = 0;
        do {
          pcVar1 = *(char **)(lVar2 + lVar10 * 8);
          sVar8 = strlen(pcVar1);
          if (0x4f < sVar8) {
            uVar6 = 0x42;
LAB_00343a4d:
            state->error = uVar6;
            break;
          }
          if (sVar8 == 0) {
            uVar6 = 0x43;
            goto LAB_00343a4d;
          }
          textstring = *(char **)(lVar9 + lVar10 * 8);
          if ((state->encoder).text_compression == 0) {
            addChunk_tEXt(&local_168,pcVar1,textstring);
          }
          else {
            addChunk_zTXt(&local_168,pcVar1,textstring,&local_150->zlibsettings);
          }
          lVar10 = lVar10 + 1;
        } while (lVar11 != lVar10);
      }
      if ((state->encoder).add_id != 0) {
        if (lVar11 != 0) {
          lVar2 = CONCAT44(uStack_c4,uStack_c8);
          lVar9 = 0;
          do {
            iVar7 = strcmp(*(char **)(lVar2 + lVar9 * 8),"LodePNG");
            if (iVar7 == 0) goto LAB_00343aa3;
            lVar9 = lVar9 + 1;
          } while (lVar11 != lVar9);
        }
        addChunk_tEXt(&local_168,"LodePNG",LODEPNG_VERSION_STRING);
      }
LAB_00343aa3:
      lVar11 = CONCAT44(uStack_b4,uStack_b8);
      if (lVar11 != 0) {
        lVar2 = CONCAT44(uStack_ac,uStack_b0);
        lVar9 = CONCAT44(uStack_a4,uStack_a8);
        local_148 = CONCAT44(uStack_9c,local_a0);
        local_138 = (LodePNGColorMode *)CONCAT44(uStack_94,local_98);
        lVar10 = 0;
        do {
          pcVar1 = *(char **)(lVar2 + lVar10 * 8);
          sVar8 = strlen(pcVar1);
          if (0x4f < sVar8) {
            uVar6 = 0x42;
LAB_00343b4b:
            state->error = uVar6;
            break;
          }
          if (sVar8 == 0) {
            uVar6 = 0x43;
            goto LAB_00343b4b;
          }
          addChunk_iTXt(&local_168,(state->encoder).text_compression,pcVar1,
                        *(char **)(lVar9 + lVar10 * 8),*(char **)(local_148 + lVar10 * 8),
                        *(char **)(&local_138->colortype + lVar10 * 2),&local_150->zlibsettings);
          lVar10 = lVar10 + 1;
        } while (lVar11 != lVar10);
      }
      if (puStack_50 != (uchar *)0x0) {
        uVar6 = addUnknownChunks(&local_168,puStack_50,local_38);
        state->error = uVar6;
        if (uVar6 != 0) goto LAB_00343806;
      }
      uVar6 = lodepng_chunk_create(&local_168.data,&local_168.size,0,"IEND",(uchar *)0x0);
      if (uVar6 == 0) {
        local_168.allocsize = local_168.size;
      }
    }
  }
LAB_00343806:
  lodepng_info_cleanup((LodePNGInfo *)local_118);
  free(local_140);
  *ppuVar13 = local_168.data;
  *local_120 = local_168.size;
  return state->error;
}

Assistant:

unsigned lodepng_encode(unsigned char** out, size_t* outsize,
                        const unsigned char* image, unsigned w, unsigned h,
                        LodePNGState* state)
{
  LodePNGInfo info;
  ucvector outv;
  unsigned char* data = 0; /*uncompressed version of the IDAT chunk data*/
  size_t datasize = 0;

  /*provide some proper output values if error will happen*/
  *out = 0;
  *outsize = 0;
  state->error = 0;

  lodepng_info_init(&info);
  lodepng_info_copy(&info, &state->info_png);

  if((info.color.colortype == LCT_PALETTE || state->encoder.force_palette)
      && (info.color.palettesize == 0 || info.color.palettesize > 256))
  {
    state->error = 68; /*invalid palette size, it is only allowed to be 1-256*/
    return state->error;
  }

  if(state->encoder.auto_convert)
  {
    state->error = lodepng_auto_choose_color(&info.color, image, w, h, &state->info_raw);
  }
  if(state->error) return state->error;

  if(state->encoder.zlibsettings.btype > 2)
  {
    CERROR_RETURN_ERROR(state->error, 61); /*error: unexisting btype*/
  }
  if(state->info_png.interlace_method > 1)
  {
    CERROR_RETURN_ERROR(state->error, 71); /*error: unexisting interlace mode*/
  }

  state->error = checkColorValidity(info.color.colortype, info.color.bitdepth);
  if(state->error) return state->error; /*error: unexisting color type given*/
  state->error = checkColorValidity(state->info_raw.colortype, state->info_raw.bitdepth);
  if(state->error) return state->error; /*error: unexisting color type given*/

  if(!lodepng_color_mode_equal(&state->info_raw, &info.color))
  {
    unsigned char* converted;
    size_t size = (w * h * (size_t)lodepng_get_bpp(&info.color) + 7) / 8;

    converted = (unsigned char*)lodepng_malloc(size);
    if(!converted && size) state->error = 83; /*alloc fail*/
    if(!state->error)
    {
      state->error = lodepng_convert(converted, image, &info.color, &state->info_raw, w, h);
    }
    if(!state->error) preProcessScanlines(&data, &datasize, converted, w, h, &info, &state->encoder);
    lodepng_free(converted);
  }
  else preProcessScanlines(&data, &datasize, image, w, h, &info, &state->encoder);

  ucvector_init(&outv);
  while(!state->error) /*while only executed once, to break on error*/
  {
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    size_t i;
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    /*write signature and chunks*/
    writeSignature(&outv);
    /*IHDR*/
    addChunk_IHDR(&outv, w, h, info.color.colortype, info.color.bitdepth, info.interlace_method);
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    /*unknown chunks between IHDR and PLTE*/
    if(info.unknown_chunks_data[0])
    {
      state->error = addUnknownChunks(&outv, info.unknown_chunks_data[0], info.unknown_chunks_size[0]);
      if(state->error) break;
    }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    /*PLTE*/
    if(info.color.colortype == LCT_PALETTE)
    {
      addChunk_PLTE(&outv, &info.color);
    }
    if(state->encoder.force_palette && (info.color.colortype == LCT_RGB || info.color.colortype == LCT_RGBA))
    {
      addChunk_PLTE(&outv, &info.color);
    }
    /*tRNS*/
    if(info.color.colortype == LCT_PALETTE && getPaletteTranslucency(info.color.palette, info.color.palettesize) != 0)
    {
      addChunk_tRNS(&outv, &info.color);
    }
    if((info.color.colortype == LCT_GREY || info.color.colortype == LCT_RGB) && info.color.key_defined)
    {
      addChunk_tRNS(&outv, &info.color);
    }
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    /*bKGD (must come between PLTE and the IDAt chunks*/
    if(info.background_defined) addChunk_bKGD(&outv, &info);
    /*pHYs (must come before the IDAT chunks)*/
    if(info.phys_defined) addChunk_pHYs(&outv, &info);

    /*unknown chunks between PLTE and IDAT*/
    if(info.unknown_chunks_data[1])
    {
      state->error = addUnknownChunks(&outv, info.unknown_chunks_data[1], info.unknown_chunks_size[1]);
      if(state->error) break;
    }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    /*IDAT (multiple IDAT chunks must be consecutive)*/
    state->error = addChunk_IDAT(&outv, data, datasize, &state->encoder.zlibsettings);
    if(state->error) break;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    /*tIME*/
    if(info.time_defined) addChunk_tIME(&outv, &info.time);
    /*tEXt and/or zTXt*/
    for(i = 0; i != info.text_num; ++i)
    {
      if(strlen(info.text_keys[i]) > 79)
      {
        state->error = 66; /*text chunk too large*/
        break;
      }
      if(strlen(info.text_keys[i]) < 1)
      {
        state->error = 67; /*text chunk too small*/
        break;
      }
      if(state->encoder.text_compression)
      {
        addChunk_zTXt(&outv, info.text_keys[i], info.text_strings[i], &state->encoder.zlibsettings);
      }
      else
      {
        addChunk_tEXt(&outv, info.text_keys[i], info.text_strings[i]);
      }
    }
    /*LodePNG version id in text chunk*/
    if(state->encoder.add_id)
    {
      unsigned alread_added_id_text = 0;
      for(i = 0; i != info.text_num; ++i)
      {
        if(!strcmp(info.text_keys[i], "LodePNG"))
        {
          alread_added_id_text = 1;
          break;
        }
      }
      if(alread_added_id_text == 0)
      {
        addChunk_tEXt(&outv, "LodePNG", LODEPNG_VERSION_STRING); /*it's shorter as tEXt than as zTXt chunk*/
      }
    }
    /*iTXt*/
    for(i = 0; i != info.itext_num; ++i)
    {
      if(strlen(info.itext_keys[i]) > 79)
      {
        state->error = 66; /*text chunk too large*/
        break;
      }
      if(strlen(info.itext_keys[i]) < 1)
      {
        state->error = 67; /*text chunk too small*/
        break;
      }
      addChunk_iTXt(&outv, state->encoder.text_compression,
                    info.itext_keys[i], info.itext_langtags[i], info.itext_transkeys[i], info.itext_strings[i],
                    &state->encoder.zlibsettings);
    }

    /*unknown chunks between IDAT and IEND*/
    if(info.unknown_chunks_data[2])
    {
      state->error = addUnknownChunks(&outv, info.unknown_chunks_data[2], info.unknown_chunks_size[2]);
      if(state->error) break;
    }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    addChunk_IEND(&outv);

    break; /*this isn't really a while loop; no error happened so break out now!*/
  }

  lodepng_info_cleanup(&info);
  lodepng_free(data);
  /*instead of cleaning the vector up, give it to the output*/
  *out = outv.data;
  *outsize = outv.size;

  return state->error;
}